

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O2

int fp_i4stat(fitsfile *infptr,int naxis,long *naxes,imgstats *imagestats,int *status)

{
  void *__ptr;
  int *piVar1;
  fitsfile *pfVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long *plVar6;
  long lVar7;
  long *plVar8;
  undefined8 in_stack_fffffffffffffe40;
  uint uVar9;
  int nullvalue;
  int local_18c;
  long *local_188;
  void *local_180;
  imgstats *local_178;
  int *local_170;
  fitsfile *local_168;
  double noise5;
  double noise3;
  double noise2;
  double noise1;
  double sigma;
  long ngood;
  int tstatus;
  int anynul;
  int maxvalue;
  int minvalue;
  double mean;
  long lpixel [9];
  long fpixel [9];
  long inc [9];
  
  uVar9 = (uint)((ulong)in_stack_fffffffffffffe40 >> 0x20);
  lVar5 = 9;
  plVar6 = &DAT_0010a230;
  plVar8 = fpixel;
  for (lVar4 = lVar5; lVar4 != 0; lVar4 = lVar4 + -1) {
    *plVar8 = *plVar6;
    plVar6 = plVar6 + 1;
    plVar8 = plVar8 + 1;
  }
  plVar6 = &DAT_0010a230;
  plVar8 = lpixel;
  for (lVar4 = lVar5; lVar4 != 0; lVar4 = lVar4 + -1) {
    *plVar8 = *plVar6;
    plVar6 = plVar6 + 1;
    plVar8 = plVar8 + 1;
  }
  plVar6 = &DAT_0010a230;
  plVar8 = inc;
  for (; lVar5 != 0; lVar5 = lVar5 + -1) {
    *plVar8 = *plVar6;
    plVar6 = plVar6 + 1;
    plVar8 = plVar8 + 1;
  }
  lVar5 = *naxes;
  lpixel[0] = (long)(XSAMPLE / 2) + lVar5 / 2;
  fpixel[0] = lVar5 / 2 - (long)(XSAMPLE / 2 + -1);
  if (fpixel[0] < 2) {
    fpixel[0] = 1;
  }
  if (lVar5 <= lpixel[0]) {
    lpixel[0] = lVar5;
  }
  lVar4 = (lpixel[0] - fpixel[0]) + 1;
  lVar5 = lVar4;
  if (1 < naxis) {
    lVar5 = naxes[1];
    lpixel[1] = (long)(YSAMPLE / 2) + lVar5 / 2;
    lVar7 = lVar5 / 2 - (long)(YSAMPLE / 2 + -1);
    fpixel[1] = 1;
    if (1 < lVar7) {
      fpixel[1] = lVar7;
    }
    if (lVar5 <= lpixel[1]) {
      lpixel[1] = lVar5;
    }
    lVar5 = (lpixel[1] - fpixel[1]) + 1;
    if (naxis != 2) {
      lpixel[2] = naxes[2] / 2 + 1;
      fpixel[2] = lpixel[2];
    }
  }
  local_18c = naxis;
  local_168 = infptr;
  local_180 = calloc(lVar5 * lVar4,4);
  pfVar2 = local_168;
  if (local_180 == (void *)0x0) {
    *status = 0x71;
    iVar3 = 0x71;
  }
  else {
    local_188 = naxes;
    local_178 = imagestats;
    ffpscl(0x3ff0000000000000,0,local_168,status);
    local_170 = status;
    ffgsvk(pfVar2,0,local_18c,local_188,fpixel,lpixel,inc,(ulong)uVar9 << 0x20,local_180,&anynul,
           status);
    tstatus = 0;
    ffgky(pfVar2,0x1f,"BLANK",&nullvalue,0,&tstatus);
    piVar1 = local_170;
    __ptr = local_180;
    if (tstatus != 0) {
      nullvalue = 0;
    }
    fits_img_stats_int(local_180,lVar4,lVar5,tstatus == 0,nullvalue,&ngood,&minvalue,&maxvalue,&mean
                       ,&sigma,&noise1,&noise2,&noise3,&noise5,local_170);
    local_178->n_nulls = (int)(lVar5 * lVar4) - (int)ngood;
    local_178->minval = (double)minvalue;
    local_178->maxval = (double)maxvalue;
    local_178->mean = mean;
    local_178->sigma = sigma;
    local_178->noise1 = noise1;
    local_178->noise2 = noise2;
    local_178->noise3 = noise3;
    local_178->noise5 = noise5;
    free(__ptr);
    iVar3 = *piVar1;
  }
  return iVar3;
}

Assistant:

int fp_i4stat(fitsfile *infptr, int naxis, long *naxes, imgstats *imagestats, int *status)
{
/*
    read the central XSAMPLE by YSAMPLE region of pixels in the int*2 image, 
    and then compute basic statistics: min, max, mean, sigma, mean diff, etc.
*/

	long fpixel[9] = {1,1,1,1,1,1,1,1,1};
	long lpixel[9] = {1,1,1,1,1,1,1,1,1};
	long inc[9]    = {1,1,1,1,1,1,1,1,1};
	long i1, i2, npix, ngood, nx, ny;
	int *intarray, minvalue, maxvalue, nullvalue;
	int anynul, tstatus, checknull = 1;
	double mean, sigma, noise1, noise2, noise3, noise5;
	
         /* select the middle XSAMPLE by YSAMPLE area of the image */
	i1 = naxes[0]/2 - (XSAMPLE/2 - 1);
	i2 = naxes[0]/2 + (XSAMPLE/2);
	if (i1 < 1) i1 = 1;
	if (i2 > naxes[0]) i2 = naxes[0];
	fpixel[0] = i1;
	lpixel[0] = i2;
	nx = i2 - i1 +1;

        if (naxis > 1) {
	    i1 = naxes[1]/2 - (YSAMPLE/2 - 1);
	    i2 = naxes[1]/2 + (YSAMPLE/2);
	    if (i1 < 1) i1 = 1;
	    if (i2 > naxes[1]) i2 = naxes[1];
	    fpixel[1] = i1;
	    lpixel[1] = i2;
	}
	ny = i2 - i1 +1;

	npix = nx * ny;

        /* if there are higher dimensions, read the middle plane of the cube */
	if (naxis > 2) {
	    fpixel[2] = naxes[2]/2 + 1;
	    lpixel[2] = naxes[2]/2 + 1;
	}

	intarray = calloc(npix, sizeof(int));
	if (!intarray) {
		*status = MEMORY_ALLOCATION;
		return(*status);
	}

	/* turn off any scaling of the integer pixel values */
	fits_set_bscale(infptr, 1.0, 0.0, status);

	fits_read_subset_int(infptr, 0, naxis, naxes, fpixel, lpixel, inc,
	    0, intarray, &anynul, status);

	/* read the null value keyword (BLANK) if present */
	tstatus = 0;
	fits_read_key(infptr, TINT, "BLANK", &nullvalue, 0, &tstatus);
	if (tstatus) {
	   nullvalue = 0;
	   checknull = 0;
	}

	/* compute statistics of the image */

        fits_img_stats_int(intarray, nx, ny, checknull, nullvalue, 
	&ngood, &minvalue, &maxvalue, &mean, &sigma, &noise1, &noise2, &noise3, &noise5, status);

	imagestats->n_nulls = npix - ngood;
	imagestats->minval = minvalue;
	imagestats->maxval = maxvalue; 
	imagestats->mean = mean; 
	imagestats->sigma = sigma; 
	imagestats->noise1 = noise1; 
	imagestats->noise2 = noise2; 
	imagestats->noise3 = noise3; 
	imagestats->noise5 = noise5; 
    
	free(intarray);
	return(*status);
}